

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar8;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_4;
  Mat borderm_1;
  int z;
  int64_t pad_value_3;
  int64_t v8_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  int64_t pad_value_2;
  int64_t v8_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  int64_t pad_value_1;
  int64_t v8_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  int64_t pad_value;
  int64_t v8;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_3;
  Mat *m;
  Mat *m_5;
  Mat *m_2;
  int i_1;
  long *ptr_1;
  int size_1;
  int i;
  long *ptr;
  int size;
  size_t in_stack_fffffffffffff638;
  Allocator *in_stack_fffffffffffff640;
  Mat *pMVar9;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff64c;
  undefined4 in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  int in_stack_fffffffffffff658;
  int in_stack_fffffffffffff65c;
  Mat *in_stack_fffffffffffff660;
  undefined7 in_stack_fffffffffffff668;
  undefined1 in_stack_fffffffffffff66f;
  int in_stack_fffffffffffff6b0;
  Allocator *in_stack_fffffffffffff6b8;
  Allocator *in_stack_fffffffffffff6c0;
  Mat local_818;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined4 local_7b8;
  Allocator *local_7b0;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined8 local_790;
  Mat local_788;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined4 local_728;
  Allocator *local_720;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  undefined8 local_700;
  Mat local_6f8;
  int local_6ac;
  ulong local_6a8;
  ulong local_6a0;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  Mat local_688;
  ulong local_630;
  ulong local_628;
  void *local_620;
  int *local_618;
  ulong local_610;
  int local_608;
  Allocator *local_600;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  int iVar10;
  Mat *in_stack_fffffffffffffa10;
  Mat *in_stack_fffffffffffffa18;
  Padding *in_stack_fffffffffffffa20;
  int local_5d8;
  int local_524;
  int local_3c4;
  int local_39c;
  
  iVar6 = in_RSI->d;
  iVar1 = in_RSI->c;
  iVar10 = in_RSI->dims;
  iVar2 = in_RSI->elempack;
  if (iVar2 == 8) {
    if (iVar10 == 1) {
      iVar3 = 1;
      if ((in_RSI->w * 8 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc)) % 8 == 0) {
        iVar3 = 8;
      }
      if (((*(int *)(in_RDI + 0xd8) % 8 == 0) && (iVar3 == 8)) && (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create(in_stack_fffffffffffff660,in_stack_fffffffffffff65c,
                    CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                    in_stack_fffffffffffff64c,in_stack_fffffffffffff640);
        bVar8 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar8 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar8) {
          uVar7 = (ulong)*(float *)(in_RDI + 0xe4);
          padding_constant_pack8_int8_sse
                    (in_RSI,in_RDX,0,0,*(int *)(in_RDI + 0xd8) / 8,*(int *)(in_RDI + 0xdc) / 8,
                     uVar7 | uVar7 << 8 | uVar7 << 0x10 | uVar7 << 0x18 | uVar7 << 0x20 |
                     uVar7 << 0x28 | uVar7 << 0x30 | uVar7 << 0x38);
          return 0;
        }
        return -100;
      }
    }
    if (iVar10 == 2) {
      iVar3 = 1;
      if ((in_RSI->h * 8 + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4)) % 8 == 0) {
        iVar3 = 8;
      }
      if (((*(int *)(in_RDI + 0xd0) % 8 == 0) && (iVar3 == 8)) && (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create(in_stack_fffffffffffff660,in_stack_fffffffffffff65c,in_stack_fffffffffffff658,
                    CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                    in_stack_fffffffffffff64c,in_stack_fffffffffffff640);
        bVar8 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar8 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar8) {
          uVar7 = (ulong)*(float *)(in_RDI + 0xe4);
          padding_constant_pack8_int8_sse
                    (in_RSI,in_RDX,*(int *)(in_RDI + 0xd0) / 8,*(int *)(in_RDI + 0xd4) / 8,
                     *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),
                     uVar7 | uVar7 << 8 | uVar7 << 0x10 | uVar7 << 0x18 | uVar7 << 0x20 |
                     uVar7 << 0x28 | uVar7 << 0x30 | uVar7 << 0x38);
          return 0;
        }
        return -100;
      }
    }
    iVar3 = (int)((ulong)in_stack_fffffffffffff640 >> 0x20);
    if (iVar10 == 3) {
      iVar4 = iVar1 * 8 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      iVar5 = 1;
      if (iVar4 % 8 == 0) {
        iVar5 = 8;
      }
      if (((*(int *)(in_RDI + 0xe8) % 8 == 0) && (iVar5 == 8)) &&
         ((iVar4 == iVar1 * 8 || (*(int *)(in_RDI + 0xe0) == 0)))) {
        Mat::create(in_stack_fffffffffffff660,in_stack_fffffffffffff65c,in_stack_fffffffffffff658,
                    in_stack_fffffffffffff654,
                    CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),iVar3,
                    in_stack_fffffffffffff6c0);
        bVar8 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar8 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar8) {
          iVar6 = *(int *)(in_RDI + 0xe8) / 8;
          for (local_5d8 = 0; local_5d8 < iVar4 / 8; local_5d8 = local_5d8 + 1) {
            local_620 = (void *)((long)in_RDX->data +
                                in_RDX->cstep * (long)local_5d8 * in_RDX->elemsize);
            local_610 = in_RDX->elemsize;
            local_608 = in_RDX->elempack;
            local_600 = in_RDX->allocator;
            local_618 = (int *)0x0;
            iVar10 = in_RDX->h;
            iVar10 = 1;
            iVar10 = in_RDX->d;
            iVar10 = (int)(((long)in_RDX->w * (long)(int)in_stack_fffffffffffffa10 * local_610 + 0xf
                           & 0xfffffffffffffff0) / local_610);
            if (in_RDX->dims == 4) {
              iVar10 = in_RDX->w * in_RDX->h;
            }
            local_628 = (ulong)*(float *)(in_RDI + 0xe4);
            local_630 = local_628 | local_628 << 8 | local_628 << 0x10 | local_628 << 0x18 |
                        local_628 << 0x20 | local_628 << 0x28 | local_628 << 0x30 |
                        local_628 << 0x38;
            if ((local_5d8 - iVar6 < 0) || (iVar1 <= local_5d8 - iVar6)) {
              for (local_39c = 0; local_39c < iVar10 * (int)in_stack_fffffffffffffa18;
                  local_39c = local_39c + 1) {
                *(ulong *)((long)local_620 + (long)local_39c * 8) = local_630;
              }
            }
            else {
              local_688.w = in_RSI->w;
              local_688.h = in_RSI->h;
              local_688.c = in_RSI->d;
              local_688.data =
                   (void *)((long)in_RSI->data +
                           in_RSI->cstep * (long)(local_5d8 - iVar6) * in_RSI->elemsize);
              local_688.elemsize = in_RSI->elemsize;
              local_688.elempack = in_RSI->elempack;
              local_688.allocator = in_RSI->allocator;
              local_688.refcount = (int *)0x0;
              local_688.d = 1;
              local_688.cstep =
                   ((long)local_688.w * (long)local_688.h * local_688.elemsize + 0xf &
                   0xfffffffffffffff0) / local_688.elemsize;
              local_688.dims = in_RSI->dims + -1;
              if (in_RSI->dims == 4) {
                local_688.cstep = (long)in_RSI->w * (long)in_RSI->h;
              }
              if (*(int *)(in_RDI + 0xe0) == 0) {
                padding_constant_pack8_int8_sse
                          (&local_688,(Mat *)&local_620,*(int *)(in_RDI + 0xd0),
                           *(int *)(in_RDI + 0xd4),*(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),
                           local_630);
              }
              if (*(int *)(in_RDI + 0xe0) == 1) {
                padding_replicate_pack8_int8_sse
                          (&local_688,(Mat *)&local_620,*(int *)(in_RDI + 0xd0),
                           *(int *)(in_RDI + 0xd4),*(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc));
              }
              if (*(int *)(in_RDI + 0xe0) == 2) {
                padding_reflect_pack8_int8_sse
                          (&local_688,(Mat *)&local_620,*(int *)(in_RDI + 0xd0),
                           *(int *)(in_RDI + 0xd4),*(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc));
              }
              if (local_688.refcount != (int *)0x0) {
                LOCK();
                iVar10 = *local_688.refcount;
                *local_688.refcount = *local_688.refcount + -1;
                UNLOCK();
                if (iVar10 == 1) {
                  if (local_688.allocator == (Allocator *)0x0) {
                    if (local_688.data != (void *)0x0) {
                      free(local_688.data);
                    }
                  }
                  else {
                    (*(local_688.allocator)->_vptr_Allocator[3])(local_688.allocator,local_688.data)
                    ;
                  }
                }
              }
              local_688.data = (void *)0x0;
              local_688.elemsize = 0;
              local_688.elempack = 0;
              local_688.dims = 0;
              local_688.w = 0;
              local_688.h = 0;
              local_688.d = 0;
              local_688.c = 0;
              local_688.cstep = 0;
              local_688.refcount = (int *)0x0;
            }
            if (local_618 != (int *)0x0) {
              LOCK();
              iVar10 = *local_618;
              *local_618 = *local_618 + -1;
              UNLOCK();
              if (iVar10 == 1) {
                if (local_600 == (Allocator *)0x0) {
                  if (local_620 != (void *)0x0) {
                    free(local_620);
                  }
                }
                else {
                  (*local_600->_vptr_Allocator[3])(local_600,local_620);
                }
              }
            }
            iVar10 = 0;
            iVar10 = 0;
          }
          return 0;
        }
        return -100;
      }
    }
    if (iVar10 == 4) {
      local_68c = in_RSI->w + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_690 = in_RSI->h + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_694 = iVar6 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (*(int *)(in_RDI + 0xe0) == 0) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                    in_stack_fffffffffffff64c,in_stack_fffffffffffff648,iVar3,
                    (int)in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                    in_stack_fffffffffffff6b0,in_stack_fffffffffffff6b8);
        bVar8 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar8 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (!bVar8) {
          for (local_698 = 0; local_698 < iVar1; local_698 = local_698 + 1) {
            local_6a0 = (ulong)*(float *)(in_RDI + 0xe4);
            local_6a8 = local_6a0 | local_6a0 << 8 | local_6a0 << 0x10 | local_6a0 << 0x18 |
                        local_6a0 << 0x20 | local_6a0 << 0x28 | local_6a0 << 0x30 |
                        local_6a0 << 0x38;
            for (local_6ac = 0; local_6ac < local_694; local_6ac = local_6ac + 1) {
              local_6f8.w = in_RDX->w;
              local_6f8.h = in_RDX->h;
              local_6f8.elemsize = in_RDX->elemsize;
              local_6f8.elempack = in_RDX->elempack;
              local_720 = in_RDX->allocator;
              local_6f8.data =
                   (void *)((long)in_RDX->data +
                           (long)local_6f8.w * (long)local_6f8.h * (long)local_6ac *
                           local_6f8.elemsize + in_RDX->cstep * (long)local_698 * in_RDX->elemsize);
              local_6f8.cstep = (long)local_6f8.w * (long)local_6f8.h;
              local_6f8.c = 1;
              local_6f8.d = 1;
              local_6f8.dims = 2;
              local_6f8.refcount = (int *)0x0;
              local_740 = 0;
              local_730 = 0;
              local_728 = 0;
              local_718 = 0;
              local_714 = 0;
              local_710 = 0;
              local_70c = 0;
              local_708 = 0;
              local_700 = 0;
              local_738 = 0;
              local_6f8.allocator = local_720;
              if ((local_6ac - *(int *)(in_RDI + 0xe8) < 0) ||
                 (iVar6 <= local_6ac - *(int *)(in_RDI + 0xe8))) {
                for (local_3c4 = 0; local_3c4 < (int)local_6f8.cstep; local_3c4 = local_3c4 + 1) {
                  *(ulong *)((long)local_6f8.data + (long)local_3c4 * 8) = local_6a8;
                }
              }
              else {
                local_788.w = in_RSI->w;
                local_788.h = in_RSI->h;
                local_788.elemsize = in_RSI->elemsize;
                local_788.elempack = in_RSI->elempack;
                local_7b0 = in_RSI->allocator;
                local_788.data =
                     (void *)((long)in_RSI->data +
                             (long)local_788.w * (long)local_788.h *
                             (long)(local_6ac - *(int *)(in_RDI + 0xe8)) * local_788.elemsize +
                             in_RSI->cstep * (long)local_698 * in_RSI->elemsize);
                local_788.cstep = (long)local_788.w * (long)local_788.h;
                local_6f8.c = 1;
                local_6f8.d = 1;
                local_6f8.dims = 2;
                local_6f8.refcount = (int *)0x0;
                local_708 = 0;
                local_70c = 0;
                local_710 = 0;
                local_714 = 0;
                local_728 = 0;
                local_730 = 0;
                local_738 = 0;
                local_740 = 0;
                local_788.c = 1;
                local_788.d = 1;
                local_788.dims = 2;
                local_788.refcount = (int *)0x0;
                local_700 = 0;
                local_718 = 0;
                local_7d0 = 0;
                local_7c0 = 0;
                local_7b8 = 0;
                local_7a8 = 0;
                local_7a4 = 0;
                local_7a0 = 0;
                local_79c = 0;
                local_798 = 0;
                local_790 = 0;
                local_7c8 = 0;
                local_788.allocator = local_7b0;
                padding_constant_pack8_int8_sse
                          (&local_788,&local_6f8,*(int *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xd4),
                           *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),local_6a8);
                if (local_788.refcount != (int *)0x0) {
                  LOCK();
                  iVar10 = *local_788.refcount;
                  *local_788.refcount = *local_788.refcount + -1;
                  UNLOCK();
                  if (iVar10 == 1) {
                    if (local_788.allocator == (Allocator *)0x0) {
                      if (local_788.data != (void *)0x0) {
                        free(local_788.data);
                      }
                    }
                    else {
                      (*(local_788.allocator)->_vptr_Allocator[3])
                                (local_788.allocator,local_788.data);
                    }
                  }
                }
                local_788.data = (void *)0x0;
                local_788.elemsize = 0;
                local_788.elempack = 0;
                local_788.dims = 0;
                local_788.w = 0;
                local_788.h = 0;
                local_788.d = 0;
                local_788.c = 0;
                local_788.cstep = 0;
                local_788.refcount = (int *)0x0;
              }
              if (local_6f8.refcount != (int *)0x0) {
                LOCK();
                iVar10 = *local_6f8.refcount;
                *local_6f8.refcount = *local_6f8.refcount + -1;
                UNLOCK();
                if (iVar10 == 1) {
                  if (local_6f8.allocator == (Allocator *)0x0) {
                    if (local_6f8.data != (void *)0x0) {
                      free(local_6f8.data);
                    }
                  }
                  else {
                    (*(local_6f8.allocator)->_vptr_Allocator[3])(local_6f8.allocator,local_6f8.data)
                    ;
                  }
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  local_818.data = in_RSI->data;
  local_818.refcount = in_RSI->refcount;
  local_818.elemsize = in_RSI->elemsize;
  local_818.elempack = in_RSI->elempack;
  local_818.allocator = in_RSI->allocator;
  local_818.dims = in_RSI->dims;
  local_818.w = in_RSI->w;
  local_818.h = in_RSI->h;
  local_818.d = in_RSI->d;
  local_818.c = in_RSI->c;
  local_818.cstep = in_RSI->cstep;
  if (local_818.refcount != (int *)0x0) {
    LOCK();
    *local_818.refcount = *local_818.refcount + 1;
    UNLOCK();
  }
  if ((iVar2 == 1) ||
     (convert_packing(&local_818,
                      (Mat *)CONCAT17(in_stack_fffffffffffff66f,in_stack_fffffffffffff668),
                      (int)((ulong)in_stack_fffffffffffff660 >> 0x20),
                      (Option *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
     local_818.data != (void *)0x0 && local_818.cstep * (long)local_818.c != 0)) {
    local_524 = Padding::forward(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                                 in_stack_fffffffffffffa10,
                                 (Option *)
                                 CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  }
  else {
    local_524 = -100;
  }
  pMVar9 = &local_818;
  if (local_818.refcount != (int *)0x0) {
    LOCK();
    iVar6 = *local_818.refcount;
    *local_818.refcount = *local_818.refcount + -1;
    UNLOCK();
    if (iVar6 == 1) {
      if (local_818.allocator == (Allocator *)0x0) {
        if (local_818.data != (void *)0x0) {
          free(local_818.data);
        }
      }
      else {
        (*(local_818.allocator)->_vptr_Allocator[3])(local_818.allocator,local_818.data);
      }
    }
  }
  pMVar9->data = (void *)0x0;
  pMVar9->elemsize = 0;
  pMVar9->elempack = 0;
  pMVar9->dims = 0;
  pMVar9->w = 0;
  pMVar9->h = 0;
  pMVar9->d = 0;
  pMVar9->c = 0;
  pMVar9->cstep = 0;
  pMVar9->refcount = (int *)0x0;
  return local_524;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}